

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

void __thiscall
QMap<QModelIndex,_QMap<QString,_QMatchData>_>::detach
          (QMap<QModelIndex,_QMap<QString,_QMatchData>_> *this)

{
  bool bVar1;
  QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>
  *in_RDI;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
  *unaff_retaddr;
  QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>
  *t;
  
  t = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
                      *)0xa7696c);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
    ::detach(unaff_retaddr);
  }
  else {
    operator_new(0x38);
    QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>
    ::QMapData(in_RDI);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QModelIndex,_QMap<QString,_QMatchData>,_std::less<QModelIndex>,_std::allocator<std::pair<const_QModelIndex,_QMap<QString,_QMatchData>_>_>_>_>_>
    ::reset(unaff_retaddr,t);
  }
  return;
}

Assistant:

void detach()
    {
        if (d)
            d.detach();
        else
            d.reset(new MapData);
    }